

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

int32_t __thiscall
xla::GraphCycles::ContractEdge(GraphCycles *this,int32_t a,int32_t b,bool *success)

{
  pointer pNVar1;
  int *piVar2;
  iterator __position;
  pointer pNVar3;
  double dVar4;
  int *piVar5;
  bool bVar6;
  const_iterator cVar7;
  long lVar8;
  int32_t y;
  __hashtable *__this;
  Rep *pRVar9;
  size_type sVar10;
  __hashtable *__this_1;
  long lVar11;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *puVar12;
  int *piVar13;
  int *piVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  OrderedNodeSet out;
  int32_t local_e4;
  bool *local_e0;
  int *local_d8;
  int *piStack_d0;
  pointer local_c8;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_c0;
  int *local_80;
  int *local_78;
  pointer local_70;
  _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  lVar11 = (long)a;
  local_80 = (int *)CONCAT44(local_80._4_4_,b);
  local_e4 = b;
  local_e0 = success;
  cVar7 = std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar11].out.value_to_index_._M_h,
                 (key_type_conflict1 *)&local_80);
  if (cVar7.super__Node_iterator_base<std::pair<const_int,_int>,_false>._M_cur == (__node_type *)0x0
     ) {
    __assert_fail("HasEdge(a, b) && \"No edge exists from a to b\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/xla/graphcycles.cc"
                  ,0x1bc,"int32_t xla::GraphCycles::ContractEdge(int32_t, int32_t, bool &)");
  }
  RemoveEdge(this,a,b);
  bVar6 = IsReachableNonConst(this,a,b);
  if (bVar6) {
    InsertEdge(this,a,b);
    *local_e0 = false;
    y = -1;
  }
  else {
    lVar8 = (long)b;
    pNVar1 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_80 = *(int **)&pNVar1[lVar8].out.value_sequence_.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl;
    local_78 = *(pointer *)
                ((long)&pNVar1[lVar8].out.value_sequence_.
                        super__Vector_base<int,_std::allocator<int>_> + 8);
    piVar2 = *(int **)&pNVar1[lVar11].out.value_sequence_.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl;
    piVar14 = *(pointer *)
               ((long)&pNVar1[lVar11].out.value_sequence_.
                       super__Vector_base<int,_std::allocator<int>_> + 8);
    y = a;
    if ((ulong)(((long)piVar14 - (long)piVar2 >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[lVar11].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[lVar11].in.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> >> 2)) <
        (ulong)(((long)local_78 - (long)local_80 >> 2) +
               ((long)*(pointer *)
                       ((long)&pNVar1[lVar8].in.value_sequence_.
                               super__Vector_base<int,_std::allocator<int>_> + 8) -
                *(long *)&pNVar1[lVar8].in.value_sequence_.
                          super__Vector_base<int,_std::allocator<int>_> >> 2))) {
      local_80 = piVar2;
      local_78 = piVar14;
      lVar8 = lVar11;
      y = b;
      b = a;
      local_e4 = a;
    }
    pNVar3 = pNVar1 + lVar8;
    puVar12 = &(pNVar3->out).value_to_index_;
    local_70 = *(pointer *)
                ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
                + 0x10);
    *(pointer *)
     ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 0x10) =
         (pointer)0x0;
    *(undefined8 *)
     &(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl = 0;
    *(pointer *)
     ((long)&(pNVar3->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) =
         (pointer)0x0;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_68,puVar12,puVar12);
    local_d8 = *(int **)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>;
    piStack_d0 = *(pointer *)
                  ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
                  + 8);
    local_c8 = *(pointer *)
                ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
                0x10);
    *(pointer *)
     ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 0x10) =
         (pointer)0x0;
    *(undefined8 *)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> = 0;
    *(pointer *)
     ((long)&(pNVar3->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8) =
         (pointer)0x0;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_Hashtable(&local_c0,&pNVar1[lVar8].in.value_to_index_);
    piVar2 = local_78;
    for (piVar14 = local_80; piVar5 = piStack_d0, piVar13 = local_d8, piVar14 != piVar2;
        piVar14 = piVar14 + 1) {
      OrderedSet<int>::Erase
                (&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar14].in,b);
    }
    for (; piVar13 != piVar5; piVar13 = piVar13 + 1) {
      OrderedSet<int>::Erase
                (&(this->rep_->node_io_).
                  super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                  ._M_impl.super__Vector_impl_data._M_start[*piVar13].out,b);
    }
    pRVar9 = this->rep_;
    __position._M_current =
         (pRVar9->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pRVar9->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&pRVar9->free_nodes_,__position,&local_e4);
      pRVar9 = this->rep_;
    }
    else {
      *__position._M_current = b;
      (pRVar9->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    pNVar1 = (pRVar9->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar10 = ((long)local_78 - (long)local_80 >> 2) +
             ((long)*(pointer *)
                     ((long)&pNVar1[y].out.value_sequence_.
                             super__Vector_base<int,_std::allocator<int>_> + 8) -
              *(long *)&pNVar1[y].out.value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl >> 2);
    auVar15._8_4_ = (int)(sVar10 >> 0x20);
    auVar15._0_8_ = sVar10;
    auVar15._12_4_ = 0x45300000;
    dVar4 = ceil(((auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) /
                 (double)((_Prime_rehash_policy *)((long)&pNVar1[y].out.value_to_index_._M_h + 0x20)
                         )->_M_max_load_factor);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::rehash(&pNVar1[y].out.value_to_index_._M_h,
             (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
    std::vector<int,_std::allocator<int>_>::reserve(&pNVar1[y].out.value_sequence_,sVar10);
    piVar2 = local_78;
    for (piVar14 = local_80; piVar14 != piVar2; piVar14 = piVar14 + 1) {
      InsertEdge(this,y,*piVar14);
    }
    pNVar3 = (this->rep_->node_io_).
             super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pNVar1 = pNVar3 + y;
    sVar10 = ((long)piStack_d0 - (long)local_d8 >> 2) +
             ((long)*(pointer *)
                     ((long)&(pNVar1->in).value_sequence_.
                             super__Vector_base<int,_std::allocator<int>_> + 8) -
              *(long *)&(pNVar1->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>
             >> 2);
    auVar16._8_4_ = (int)(sVar10 >> 0x20);
    auVar16._0_8_ = sVar10;
    auVar16._12_4_ = 0x45300000;
    dVar4 = ceil(((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sVar10) - 4503599627370496.0)) /
                 (double)((_Prime_rehash_policy *)((long)&(pNVar1->in).value_to_index_._M_h + 0x20))
                         ->_M_max_load_factor);
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::rehash(&(pNVar1->in).value_to_index_._M_h,
             (long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)(pNVar3 + y),sVar10);
    piVar2 = piStack_d0;
    for (piVar14 = local_d8; piVar14 != piVar2; piVar14 = piVar14 + 1) {
      InsertEdge(this,*piVar14,y);
    }
    *local_e0 = true;
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_c0);
    if (local_d8 != (int *)0x0) {
      operator_delete(local_d8,(long)local_c8 - (long)local_d8);
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (local_80 != (int *)0x0) {
      operator_delete(local_80,(long)local_70 - (long)local_80);
    }
  }
  return y;
}

Assistant:

int32_t GraphCycles::ContractEdge(int32_t a, int32_t b, bool &success) {
  assert(HasEdge(a, b) && "No edge exists from a to b");
  RemoveEdge(a, b);

  if (IsReachableNonConst(a, b)) {
    // Restore the graph to its original state.
    InsertEdge(a, b);
    success = false;
    return -1;
  }

  if (rep_->node_io_[b].in.Size() + rep_->node_io_[b].out.Size() >
      rep_->node_io_[a].in.Size() + rep_->node_io_[a].out.Size()) {
    // Swap "a" and "b" to minimize copying.
    std::swap(a, b);
  }

  NodeIO* nb_io = &rep_->node_io_[b];
  OrderedNodeSet out = std::move(nb_io->out);
  OrderedNodeSet in = std::move(nb_io->in);
  for (int32_t y : out.GetSequence()) {
    rep_->node_io_[y].in.Erase(b);
  }
  for (int32_t y : in.GetSequence()) {
    rep_->node_io_[y].out.Erase(b);
  }
  rep_->free_nodes_.push_back(b);

  rep_->node_io_[a].out.Reserve(rep_->node_io_[a].out.Size() + out.Size());
  for (int32_t y : out.GetSequence()) {
    InsertEdge(a, y);
  }

  rep_->node_io_[a].in.Reserve(rep_->node_io_[a].in.Size() + in.Size());
  for (int32_t y : in.GetSequence()) {
    InsertEdge(y, a);
  }

  // Note, if the swap happened it might be what originally was called "b".
  success = true;
  return a;
}